

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinear.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinear::Update(ChLinkMotorLinear *this,double mytime,bool update_assets)

{
  ChBodyFrame *pCVar1;
  ChFrameMoving<double> aframe12;
  ChFrameMoving<double> aframe2;
  ChFrameMoving<double> aframe1;
  ChQuaternion<double> local_448;
  undefined1 local_428 [16];
  double local_418;
  undefined1 local_410 [16];
  double dStack_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double dStack_3c8;
  double dStack_3c0;
  double dStack_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double dStack_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  ChFrameMoving<double> local_318;
  ChFrameMoving<double> local_220;
  ChFrameMoving<double> local_128;
  
  ChLinkMotor::Update(&this->super_ChLinkMotor,mytime,update_assets);
  local_220.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.pos.m_data[0];
  local_220.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.pos.m_data[1];
  local_220.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.pos.m_data[2];
  local_220.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[0];
  local_220.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[1];
  local_220.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[2];
  local_220.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[3];
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 8);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x10);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x18);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x20);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x28);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x30);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x38);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x40);
  local_220.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b278;
  local_220.coord_dt.pos.m_data[0] = 0.0;
  local_220.coord_dt.pos.m_data[1] = 0.0;
  local_220.coord_dt.pos.m_data[2] = 0.0;
  local_220.coord_dtdt.pos.m_data[0] = 0.0;
  local_220.coord_dtdt.pos.m_data[1] = 0.0;
  local_220.coord_dtdt.pos.m_data[2] = 0.0;
  local_220.coord_dtdt.rot.m_data[0] = 0.0;
  local_220.coord_dtdt.rot.m_data[1] = 0.0;
  local_220.coord_dtdt.rot.m_data[2] = 0.0;
  local_220.coord_dtdt.rot.m_data[3] = 0.0;
  local_220.coord_dt.rot.m_data[0] = 0.0;
  local_220.coord_dt.rot.m_data[1] = 0.0;
  local_220.coord_dt.rot.m_data[2] = 0.0;
  local_220.coord_dt.rot.m_data[3] = 0.0;
  pCVar1 = (this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body1;
  local_318.super_ChFrame<double>.coord.pos.m_data[0] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  local_318.super_ChFrame<double>.coord.pos.m_data[1] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_318.super_ChFrame<double>.coord.pos.m_data[2] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  local_318.super_ChFrame<double>.coord.rot.m_data[0] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_318.super_ChFrame<double>.coord.rot.m_data[1] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_318.super_ChFrame<double>.coord.rot.m_data[2] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_318.super_ChFrame<double>.coord.rot.m_data[3] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  local_318.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b278;
  local_318.coord_dt.pos.m_data[0] = (pCVar1->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  local_318.coord_dt.pos.m_data[1] = (pCVar1->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  local_318.coord_dt.pos.m_data[2] = (pCVar1->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  local_318.coord_dt.rot.m_data[0] = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_318.coord_dt.rot.m_data[1] = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_318.coord_dt.rot.m_data[2] = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_318.coord_dt.rot.m_data[3] = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  local_318.coord_dtdt.pos.m_data[0] =
       (pCVar1->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  local_318.coord_dtdt.pos.m_data[1] =
       (pCVar1->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  local_318.coord_dtdt.pos.m_data[2] =
       (pCVar1->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  local_318.coord_dtdt.rot.m_data[0] =
       (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[0];
  local_318.coord_dtdt.rot.m_data[1] =
       (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
  local_318.coord_dtdt.rot.m_data[2] =
       (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
  local_318.coord_dtdt.rot.m_data[3] =
       (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  local_448.m_data[2] = 0.0;
  register0x00001200 = ZEXT816(0) << 0x20;
  local_448.m_data[0] = 0.0;
  local_448.m_data[1] = SUB168(ZEXT816(0),4);
  local_410._0_8_ = (_func_int **)0x3ff0000000000000;
  local_3f8 = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_448,(ChQuaternion<double> *)local_410);
  ChFrameMoving<double>::TransformLocalToParent(&local_318,&local_220,&local_128);
  local_318.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.pos.m_data[0];
  local_318.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.pos.m_data[1];
  local_318.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.pos.m_data[2];
  local_318.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[0];
  local_318.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[1];
  local_318.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[2];
  local_318.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[3];
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 8);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x10);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x18);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x20);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x28);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x30);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x38);
  local_318.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x40);
  local_318.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b278;
  local_318.coord_dt.pos.m_data[0] = 0.0;
  local_318.coord_dt.pos.m_data[1] = 0.0;
  local_318.coord_dt.pos.m_data[2] = 0.0;
  local_318.coord_dtdt.pos.m_data[0] = 0.0;
  local_318.coord_dtdt.pos.m_data[1] = 0.0;
  local_318.coord_dtdt.pos.m_data[2] = 0.0;
  local_318.coord_dtdt.rot.m_data[0] = 0.0;
  local_318.coord_dtdt.rot.m_data[1] = 0.0;
  local_318.coord_dtdt.rot.m_data[2] = 0.0;
  local_318.coord_dtdt.rot.m_data[3] = 0.0;
  local_318.coord_dt.rot.m_data[0] = 0.0;
  local_318.coord_dt.rot.m_data[1] = 0.0;
  local_318.coord_dt.rot.m_data[2] = 0.0;
  local_318.coord_dt.rot.m_data[3] = 0.0;
  pCVar1 = (this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body2;
  local_410._8_8_ = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dStack_400 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_3f8 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  local_3f0 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_3e8 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_3e0 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_3d8 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_3d0 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
              super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  dStack_3c8 = *(double *)
                ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 8);
  dStack_3c0 = *(double *)
                ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x10);
  dStack_3b8 = *(double *)
                ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x18);
  dStack_3b0 = *(double *)
                ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  dStack_3a8 = *(double *)
                ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x28);
  dStack_3a0 = *(double *)
                ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x30);
  dStack_398 = *(double *)
                ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x38);
  local_390 = *(double *)
               ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                       super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
               + 0x40);
  local_410._0_8_ = &PTR__ChFrame_00b2b278;
  local_388 = (pCVar1->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  local_380 = (pCVar1->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  local_378 = (pCVar1->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  local_370 = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_368 = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_360 = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_358 = (pCVar1->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  local_350 = (pCVar1->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  local_348 = (pCVar1->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  local_340 = (pCVar1->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  local_338 = (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[0];
  local_330 = (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
  local_328 = (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
  local_320 = (pCVar1->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  local_418 = 0.0;
  local_428 = ZEXT816(0) << 0x20;
  local_448.m_data[0] = 1.0;
  local_448.m_data[1] = 0.0;
  local_448.m_data[2] = SUB168(ZEXT816(0),4);
  local_448.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_220,(ChVector<double> *)local_428,&local_448);
  ChFrameMoving<double>::TransformLocalToParent
            ((ChFrameMoving<double> *)local_410,&local_318,&local_220);
  local_448.m_data[2] = 0.0;
  local_448.m_data[0] = 0.0;
  local_448.m_data[1] = 0.0;
  local_410._0_8_ = (_func_int **)0x3ff0000000000000;
  stack0xfffffffffffffbf8 = ZEXT816(0);
  local_3f8 = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_318,(ChVector<double> *)&local_448,(ChQuaternion<double> *)local_410);
  ChFrameMoving<double>::TransformParentToLocal(&local_220,&local_128,&local_318);
  this->mpos = local_318.super_ChFrame<double>.coord.pos.m_data[0];
  this->mpos_dt = local_318.coord_dt.pos.m_data[0];
  this->mpos_dtdt = local_318.coord_dtdt.pos.m_data[0];
  return;
}

Assistant:

void ChLinkMotorLinear::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotor::Update(mytime, update_assets);

    // compute aux data for future reference (istantaneous pos speed accel)
    ChFrameMoving<> aframe1 = ChFrameMoving<>(this->frame1) >> (ChFrameMoving<>)(*this->Body1);
    ChFrameMoving<> aframe2 = ChFrameMoving<>(this->frame2) >> (ChFrameMoving<>)(*this->Body2);
    ChFrameMoving<> aframe12;
    aframe2.TransformParentToLocal(aframe1, aframe12);

    //// RADU TODO: revisit this.
    //// This is incorrect for GuideConstraint::FREE
    //// Should use something like sqrt(Vdot(relpos,relpos)), but taking into account sign?

    this->mpos = aframe12.GetPos().x();
    this->mpos_dt = aframe12.GetPos_dt().x();
    this->mpos_dtdt = aframe12.GetPos_dtdt().x();
}